

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

int err_string_cmp(void *a,void *b)

{
  uint32_t b_key;
  uint32_t a_key;
  void *b_local;
  void *a_local;
  
  if (*a >> 0xf < *b >> 0xf) {
    a_local._4_4_ = -1;
  }
  else if (*b >> 0xf < *a >> 0xf) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int err_string_cmp(const void *a, const void *b) {
  const uint32_t a_key = *((const uint32_t *)a) >> 15;
  const uint32_t b_key = *((const uint32_t *)b) >> 15;

  if (a_key < b_key) {
    return -1;
  } else if (a_key > b_key) {
    return 1;
  } else {
    return 0;
  }
}